

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O1

void __thiscall tonk::BandwidthShape::Compress(BandwidthShape *this,uint8_t *buffer)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint8_t uVar4;
  int iVar5;
  undefined2 uVar6;
  
  if (0.01 < this->FECRate) {
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x44000000),0),ZEXT416((uint)(this->FECRate + -0.01)),
                             ZEXT416(0x3f000000));
    iVar5 = (int)auVar2._0_4_;
    if (0 < iVar5) {
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      uVar4 = (uint8_t)iVar5;
      goto LAB_001151c2;
    }
  }
  uVar4 = '\0';
LAB_001151c2:
  uVar1 = this->AppBPS;
  if (uVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar3 = (0x15U - LZCOUNT(uVar1)) * 0x800 | uVar1 >> (0x15U - LZCOUNT(uVar1) & 0x1f);
    if (uVar1 < 0x800) {
      uVar3 = uVar1;
    }
    uVar6 = (undefined2)uVar3;
  }
  *(undefined2 *)buffer = uVar6;
  buffer[2] = uVar4;
  return;
}

Assistant:

void BandwidthShape::Compress(uint8_t* buffer) const
{
    uint8_t fecRateByte = FECRateToByte(FECRate);

    const uint32_t dwordAppBPS = (uint32_t)AppBPS;
    TONK_DEBUG_ASSERT(dwordAppBPS >= protocol::kMinimumBytesPerSecond);

    const uint16_t wordAppBPS = FixedPointCompress32to16(dwordAppBPS);

    siamese::WriteU16_LE(buffer, wordAppBPS);
    buffer[2] = fecRateByte;
}